

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestCase::Run(TestCase *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  __time_t _Var3;
  pointer ppTVar4;
  OsStackTraceGetterInterface *pOVar5;
  undefined **ppuVar6;
  long lVar7;
  long lVar8;
  timeval now;
  timeval local_40;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar2 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_case_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar6 = &PTR__OsStackTraceGetterInterface_001f86a8;
      pOVar5->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_001f86a8;
      pUVar2->os_stack_trace_getter_ = pOVar5;
    }
    else {
      ppuVar6 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar6)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x1b041e,(char *)0x0)
    ;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    _Var3 = local_40.tv_sec;
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_usec),8);
    ppTVar4 = (this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
      lVar8 = 0;
      do {
        TestInfo::Run(ppTVar4[(uint)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar8]]);
        lVar8 = lVar8 + 1;
        ppTVar4 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar4) >> 3));
    }
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    this->elapsed_time_ =
         (local_40.tv_sec - _Var3) * 1000 +
         local_40.tv_usec / 1000 + ((lVar7 >> 7) - (lVar7 >> 0x3f));
    if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar6 = &PTR__OsStackTraceGetterInterface_001f86a8;
      pOVar5->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_001f86a8;
      pUVar2->os_stack_trace_getter_ = pOVar5;
    }
    else {
      ppuVar6 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar6)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x1b0422,(char *)0x0)
    ;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    pUVar2->current_test_case_ = (TestCase *)0x0;
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}